

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseUnaryOp.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *xpr)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  uVar1 = (xpr->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  uVar7 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar7 = uVar1;
  }
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ).
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
           .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
           data;
  if (uVar1 + 1 < 3) {
    dVar10 = *pdVar2 * *pdVar2;
    if (1 < (long)uVar1) {
      uVar7 = 1;
      do {
        dVar10 = dVar10 + pdVar2[uVar7] * pdVar2[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else {
    uVar8 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
    dVar13 = *pdVar2 * *pdVar2;
    dVar10 = pdVar2[1] * pdVar2[1];
    if (3 < (long)uVar1) {
      uVar7 = uVar7 & 0xfffffffffffffffc;
      dVar11 = pdVar2[2] * pdVar2[2];
      dVar12 = pdVar2[3] * pdVar2[3];
      if (7 < (long)uVar1) {
        lVar9 = 4;
        do {
          dVar3 = pdVar2[lVar9];
          dVar4 = (pdVar2 + lVar9)[1];
          dVar5 = (pdVar2 + 2)[lVar9];
          dVar6 = (pdVar2 + 2 + lVar9)[1];
          dVar13 = dVar13 + dVar3 * dVar3;
          dVar10 = dVar10 + dVar4 * dVar4;
          dVar11 = dVar11 + dVar5 * dVar5;
          dVar12 = dVar12 + dVar6 * dVar6;
          lVar9 = lVar9 + 4;
        } while (lVar9 < (long)uVar7);
      }
      dVar13 = dVar11 + dVar13;
      dVar10 = dVar12 + dVar10;
      if ((long)uVar7 < (long)uVar8) {
        dVar11 = pdVar2[uVar7];
        dVar12 = (pdVar2 + uVar7)[1];
        dVar13 = dVar13 + dVar11 * dVar11;
        dVar10 = dVar10 + dVar12 * dVar12;
      }
    }
    dVar10 = dVar10 + dVar13;
    if ((long)uVar8 < (long)uVar1) {
      do {
        dVar10 = dVar10 + pdVar2[uVar8] * pdVar2[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
  }
  return dVar10;
}

Assistant:

EIGEN_CONSTEXPR
    Index rows() const EIGEN_NOEXCEPT { return m_xpr.rows(); }